

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O0

HeaderState __thiscall HttpData::parseHeaders(HttpData *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end_00;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  reference pvVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  string value;
  string key;
  size_t i;
  bool notFinish;
  int now_read_line_begin;
  int value_end;
  int value_start;
  int key_end;
  int key_start;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  mapped_type *in_stack_fffffffffffffeb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffffed8;
  byte bVar4;
  key_type *in_stack_fffffffffffffee8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined1 local_d1 [9];
  char *local_c8;
  char *local_c0;
  char *local_b8;
  allocator<char> local_79;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  byte local_2d;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (in_RDI._M_current + 0x30);
  local_1c = -1;
  local_20 = -1;
  local_24 = -1;
  local_28 = -1;
  local_2c = 0;
  local_2d = 1;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    this_00 = local_38;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (local_18);
    bVar4 = 0;
    if (this_00 < pbVar2) {
      bVar4 = local_2d;
    }
    if ((bVar4 & 1) == 0) break;
    in_stack_fffffffffffffec8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)*(uint *)(in_RDI._M_current + 200);
    iVar1 = (int)local_38;
    switch(in_stack_fffffffffffffec8) {
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if ((*pvVar3 != '\n') &&
         (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8),
         *pvVar3 != '\r')) {
        in_RDI._M_current[200] = '\x01';
        in_RDI._M_current[0xc9] = '\0';
        in_RDI._M_current[0xca] = '\0';
        in_RDI._M_current[0xcb] = '\0';
        local_2c = (int)local_38;
        local_1c = local_2c;
      }
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (*pvVar3 == ':') {
        local_20 = (int)local_38;
        if (local_20 - local_1c < 1) {
          return PARSE_HEADER_ERROR;
        }
        in_RDI._M_current[200] = '\x02';
        in_RDI._M_current[0xc9] = '\0';
        in_RDI._M_current[0xca] = '\0';
        in_RDI._M_current[0xcb] = '\0';
      }
      else {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        if ((*pvVar3 == '\n') ||
           (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8),
           *pvVar3 == '\r')) {
          return PARSE_HEADER_ERROR;
        }
      }
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (*pvVar3 != ' ') {
        return PARSE_HEADER_ERROR;
      }
      in_RDI._M_current[200] = '\x03';
      in_RDI._M_current[0xc9] = '\0';
      in_RDI._M_current[0xca] = '\0';
      in_RDI._M_current[0xcb] = '\0';
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
      in_RDI._M_current[200] = '\x04';
      in_RDI._M_current[0xc9] = '\0';
      in_RDI._M_current[0xca] = '\0';
      in_RDI._M_current[0xcb] = '\0';
      local_24 = iVar1;
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (*pvVar3 == '\r') {
        in_RDI._M_current[200] = '\x05';
        in_RDI._M_current[0xc9] = '\0';
        in_RDI._M_current[0xca] = '\0';
        in_RDI._M_current[0xcb] = '\0';
        local_28 = (int)local_38;
        if (local_28 - local_24 < 1) {
          return PARSE_HEADER_ERROR;
        }
      }
      else if (0xff < (ulong)((long)local_38 - (long)local_24)) {
        return PARSE_HEADER_ERROR;
      }
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (*pvVar3 != '\n') {
        return PARSE_HEADER_ERROR;
      }
      in_RDI._M_current[200] = '\x06';
      in_RDI._M_current[0xc9] = '\0';
      in_RDI._M_current[0xca] = '\0';
      in_RDI._M_current[0xcb] = '\0';
      local_68 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                   (in_stack_fffffffffffffea8);
      local_60 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(in_stack_fffffffffffffeb8,
                                     (difference_type)in_stack_fffffffffffffeb0);
      local_78 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                   (in_stack_fffffffffffffea8);
      local_70 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(in_stack_fffffffffffffeb8,
                                     (difference_type)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffec0 = &local_79;
      std::allocator<char>::allocator();
      __end._M_current._7_1_ = bVar4;
      __end._M_current._0_7_ = in_stack_fffffffffffffed8;
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (this_00,in_RDI,__end,(allocator<char> *)in_stack_fffffffffffffec8);
      std::allocator<char>::~allocator(&local_79);
      local_c0 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                   (in_stack_fffffffffffffea8);
      local_b8 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(in_stack_fffffffffffffeb8,
                                     (difference_type)in_stack_fffffffffffffeb0);
      local_d1._1_8_ =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (in_stack_fffffffffffffea8);
      local_c8 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(in_stack_fffffffffffffeb8,
                                     (difference_type)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffeb8 =
           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_d1;
      std::allocator<char>::allocator();
      __end_00._M_current._7_1_ = bVar4;
      __end_00._M_current._0_7_ = in_stack_fffffffffffffed8;
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (this_00,in_RDI,__end_00,(allocator<char> *)in_stack_fffffffffffffec8);
      std::allocator<char>::~allocator((allocator<char> *)local_d1);
      in_stack_fffffffffffffeb0 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_2c = (int)local_38;
      std::__cxx11::string::~string(in_stack_fffffffffffffeb0);
      std::__cxx11::string::~string(in_stack_fffffffffffffeb0);
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (*pvVar3 == '\r') {
        in_RDI._M_current[200] = '\a';
        in_RDI._M_current[0xc9] = '\0';
        in_RDI._M_current[0xca] = '\0';
        in_RDI._M_current[0xcb] = '\0';
      }
      else {
        local_1c = (int)local_38;
        in_RDI._M_current[200] = '\x01';
        in_RDI._M_current[0xc9] = '\0';
        in_RDI._M_current[0xca] = '\0';
        in_RDI._M_current[0xcb] = '\0';
      }
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (*pvVar3 != '\n') {
        return PARSE_HEADER_ERROR;
      }
      in_RDI._M_current[200] = '\b';
      in_RDI._M_current[0xc9] = '\0';
      in_RDI._M_current[0xca] = '\0';
      in_RDI._M_current[0xcb] = '\0';
      break;
    case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
      local_2d = 0;
      local_2c = iVar1;
      local_1c = iVar1;
    }
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(local_38->_M_dataplus)._M_p + 1);
  }
  if (*(int *)(in_RDI._M_current + 200) == 8) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffec8,(size_type)in_stack_fffffffffffffec0,
               (size_type)in_stack_fffffffffffffeb8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(in_stack_fffffffffffffeb0);
    return PARSE_HEADER_SUCCESS;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffec8,(size_type)in_stack_fffffffffffffec0,
             (size_type)in_stack_fffffffffffffeb8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb0);
  return PARSE_HEADER_AGAIN;
}

Assistant:

HeaderState HttpData::parseHeaders() {
  string &str = inBuffer_;
  int key_start = -1, key_end = -1, value_start = -1, value_end = -1;
  int now_read_line_begin = 0;
  bool notFinish = true;
  size_t i = 0;
  for (; i < str.size() && notFinish; ++i) {
    switch (hState_) {
      case H_START: {
        if (str[i] == '\n' || str[i] == '\r') break;
        hState_ = H_KEY;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
      case H_KEY: {
        if (str[i] == ':') {
          key_end = i;
          if (key_end - key_start <= 0) return PARSE_HEADER_ERROR;
          hState_ = H_COLON;
        } else if (str[i] == '\n' || str[i] == '\r')
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_COLON: {
        if (str[i] == ' ') {
          hState_ = H_SPACES_AFTER_COLON;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_SPACES_AFTER_COLON: {
        hState_ = H_VALUE;
        value_start = i;
        break;
      }
      case H_VALUE: {
        if (str[i] == '\r') {
          hState_ = H_CR;
          value_end = i;
          if (value_end - value_start <= 0) return PARSE_HEADER_ERROR;
        } else if (i - value_start > 255)
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_CR: {
        if (str[i] == '\n') {
          hState_ = H_LF;
          string key(str.begin() + key_start, str.begin() + key_end);
          string value(str.begin() + value_start, str.begin() + value_end);
          headers_[key] = value;
          now_read_line_begin = i;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_LF: {
        if (str[i] == '\r') {
          hState_ = H_END_CR;
        } else {
          key_start = i;
          hState_ = H_KEY;
        }
        break;
      }
      case H_END_CR: {
        if (str[i] == '\n') {
          hState_ = H_END_LF;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_END_LF: {
        notFinish = false;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
    }
  }
  if (hState_ == H_END_LF) {
    str = str.substr(i);
    return PARSE_HEADER_SUCCESS;
  }
  str = str.substr(now_read_line_begin);
  return PARSE_HEADER_AGAIN;
}